

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertWCharTImpl
          (anon_unknown_53 *this,wchar_t v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  FormatConversionSpecImpl conv_00;
  undefined4 in_register_00000034;
  bool local_6d;
  string_view local_50;
  size_t local_40;
  size_t chars_written;
  ShiftState s;
  FormatSinkImpl *pFStack_30;
  char mb [4];
  FormatSinkImpl *sink_local;
  wchar_t v_local;
  FormatConversionSpecImpl conv_local;
  
  conv_00.width_ = in_register_00000034;
  conv_00._0_4_ = v;
  pFStack_30 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  ShiftState::ShiftState((ShiftState *)((long)&chars_written + 2));
  local_40 = WideToUtf8((wchar_t)this,(char *)((long)&chars_written + 4),
                        (ShiftState *)((long)&chars_written + 2));
  local_6d = false;
  if ((local_40 != 0xffffffffffffffff) && (local_6d = false, (chars_written._2_1_ & 1) == 0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,(char *)((long)&chars_written + 4),local_40);
    conv_00.precision_ = conv._0_4_;
    local_6d = ConvertStringArg(local_50,conv_00,pFStack_30);
  }
  return local_6d;
}

Assistant:

bool ConvertWCharTImpl(wchar_t v, const FormatConversionSpecImpl conv,
                       FormatSinkImpl *sink) {
  char mb[4];
  ShiftState s;
  const size_t chars_written = WideToUtf8(v, mb, s);
  return chars_written != static_cast<size_t>(-1) && !s.saw_high_surrogate &&
         ConvertStringArg(string_view(mb, chars_written), conv, sink);
}